

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O3

unique_ptr<duckdb::IndexScanState,_std::default_delete<duckdb::IndexScanState>,_true> __thiscall
duckdb::ART::TryInitializeScan(ART *this,Expression *expr,Expression *filter_expr)

{
  bool bVar1;
  ExpressionType type;
  ExpressionType EVar2;
  ExpressionType expression_type;
  int iVar3;
  reference pvVar4;
  BoundComparisonExpression *pBVar5;
  BoundConstantExpression *pBVar6;
  pointer pEVar7;
  BoundBetweenExpression *pBVar8;
  ARTIndexScanState *__s;
  pointer pAVar9;
  Expression *in_RCX;
  Value *pVVar10;
  long lVar11;
  Value constant_value;
  vector<std::reference_wrapper<duckdb::Expression>,_true> bindings;
  Value low_value;
  Value high_value;
  Value equal_value;
  _Head_base<0UL,_duckdb::ARTIndexScanState_*,_false> local_1e0;
  Value local_1d8;
  vector<std::reference_wrapper<duckdb::Expression>,_true> local_198;
  undefined1 local_178 [32];
  pointer local_158;
  pointer puStack_150;
  pointer local_148;
  Policy local_140;
  LogicalType local_138;
  LogicalType local_120;
  LogicalType local_108;
  Value local_f0;
  Value local_b0;
  Value local_70;
  
  LogicalType::LogicalType(&local_108,SQLNULL);
  Value::Value(&local_f0,&local_108);
  LogicalType::~LogicalType(&local_108);
  LogicalType::LogicalType(&local_120,SQLNULL);
  Value::Value(&local_b0,&local_120);
  LogicalType::~LogicalType(&local_120);
  LogicalType::LogicalType(&local_138,SQLNULL);
  Value::Value(&local_70,&local_138);
  LogicalType::~LogicalType(&local_138);
  local_178[8] = BOUND_COMPARISON;
  local_178._16_8_ =
       (tuple<duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>)
       0x0;
  local_178._24_8_ = (tuple<duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>)0x0;
  local_178._0_8_ = &PTR__ComparisonExpressionMatcher_024715b8;
  local_158 = (pointer)0x0;
  puStack_150 = (pointer)0x0;
  local_148 = (pointer)0x0;
  local_140 = INVALID;
  local_178._16_8_ = operator_new(8);
  *(undefined ***)local_178._16_8_ = &PTR__ExpressionTypeMatcher_0246f660;
  local_1d8.type_._0_8_ = operator_new(0x28);
  ((ExpressionMatcher *)local_1d8.type_._0_8_)->expr_class = INVALID;
  (((ExpressionMatcher *)local_1d8.type_._0_8_)->expr_type).
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       = (unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
          )0x0;
  (((ExpressionMatcher *)local_1d8.type_._0_8_)->type).
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_> =
       (unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>)0x0;
  ((ExpressionMatcher *)local_1d8.type_._0_8_)->_vptr_ExpressionMatcher =
       (_func_int **)&PTR__ExpressionMatcher_02471538;
  ((ExpressionMatcher *)(local_1d8.type_._0_8_ + 0x20))->_vptr_ExpressionMatcher =
       (_func_int **)filter_expr;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&local_158,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_1d8);
  if ((ExpressionMatcher *)local_1d8.type_._0_8_ != (ExpressionMatcher *)0x0) {
    (**(code **)(*(long *)local_1d8.type_._0_8_ + 8))();
  }
  local_1d8.type_._0_8_ = operator_new(0x20);
  *(undefined1 *)(local_1d8.type_._0_8_ + 8) = 0x1f;
  *(long *)(local_1d8.type_._0_8_ + 0x10) = 0;
  *(long *)(local_1d8.type_._0_8_ + 0x18) = 0;
  *(undefined ***)local_1d8.type_._0_8_ = &PTR__ExpressionMatcher_02450fc8;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&local_158,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_1d8);
  if ((_Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       )local_1d8.type_._0_8_ != (ExpressionMatcher *)0x0) {
    (**(code **)(*(long *)local_1d8.type_._0_8_ + 8))();
  }
  local_140 = UNORDERED;
  local_198.
  super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = ComparisonExpressionMatcher::Match
                    ((ComparisonExpressionMatcher *)local_178,in_RCX,&local_198);
  if (bVar1) {
    pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[](&local_198,0);
    pBVar5 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                       (&pvVar4->_M_data->super_BaseExpression);
    pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[](&local_198,2);
    pBVar6 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                       (&pvVar4->_M_data->super_BaseExpression);
    Value::Value(&local_1d8,&pBVar6->value);
    type = (pBVar5->super_Expression).super_BaseExpression.type;
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&pBVar5->left);
    if ((pEVar7->super_BaseExpression).type == VALUE_CONSTANT) {
      type = FlipComparisonExpression(type);
    }
    if (type == COMPARE_BOUNDARY_START) {
      Value::operator=(&local_70,&local_1d8);
      EVar2 = INVALID;
LAB_016ef11b:
      type = INVALID;
    }
    else {
      if ((type & 0xfd) != COMPARE_GREATERTHAN) {
        Value::operator=(&local_b0,&local_1d8);
        EVar2 = type;
        goto LAB_016ef11b;
      }
      Value::operator=(&local_f0,&local_1d8);
      EVar2 = INVALID;
    }
    Value::~Value(&local_1d8);
LAB_016ef127:
    pVVar10 = &local_70;
    expression_type = COMPARE_BOUNDARY_START;
    if (local_70.is_null == true) {
      if (local_f0.is_null == true) {
        pVVar10 = &local_b0;
        expression_type = EVar2;
        if (local_b0.is_null != false) goto LAB_016ef14f;
      }
      else {
        if (local_b0.is_null == false) {
          __s = (ARTIndexScanState *)operator_new(0xa8);
          lVar11 = 0;
          switchD_010444a0::default(__s,0,0xa8);
          (__s->super_IndexScanState)._vptr_IndexScanState =
               (_func_int **)&PTR__ARTIndexScanState_0246f5c8;
          pVVar10 = __s->values;
          do {
            LogicalType::LogicalType(&local_1d8.type_,SQLNULL);
            Value::Value(pVVar10,&local_1d8.type_);
            LogicalType::~LogicalType(&local_1d8.type_);
            lVar11 = lVar11 + -0x40;
            pVVar10 = pVVar10 + 1;
          } while (lVar11 != -0x80);
          __s->checked = false;
          (__s->row_ids).super_vector<long,_std::allocator<long>_>.
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
               (pointer)0x0;
          (__s->row_ids).super_vector<long,_std::allocator<long>_>.
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
               = (pointer)0x0;
          (__s->row_ids).super_vector<long,_std::allocator<long>_>.
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_1e0._M_head_impl = __s;
          pAVar9 = unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                   ::operator->((unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                                 *)&local_1e0);
          Value::operator=(pAVar9->values,&local_f0);
          pAVar9 = unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                   ::operator->((unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                                 *)&local_1e0);
          pAVar9->expressions[0] = type;
          pAVar9 = unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                   ::operator->((unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                                 *)&local_1e0);
          Value::operator=(pAVar9->values + 1,&local_b0);
          pAVar9 = unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                   ::operator->((unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                                 *)&local_1e0);
          pAVar9->expressions[1] = EVar2;
          (this->super_BoundIndex).super_Index._vptr_Index = (_func_int **)local_1e0._M_head_impl;
          goto LAB_016ef17f;
        }
        pVVar10 = &local_f0;
        expression_type = type;
      }
    }
    InitializeScanSinglePredicate((duckdb *)this,pVVar10,expression_type);
  }
  else {
    if ((in_RCX->super_BaseExpression).type != COMPARE_BETWEEN) {
      EVar2 = INVALID;
      type = INVALID;
      goto LAB_016ef127;
    }
    pBVar8 = BaseExpression::Cast<duckdb::BoundBetweenExpression>(&in_RCX->super_BaseExpression);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&pBVar8->input);
    iVar3 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[10])(pEVar7,filter_expr);
    if ((char)iVar3 != '\0') {
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&pBVar8->lower);
      if ((pEVar7->super_BaseExpression).type == VALUE_CONSTANT) {
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(&pBVar8->upper);
        if ((pEVar7->super_BaseExpression).type == VALUE_CONSTANT) {
          pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(&pBVar8->lower);
          pBVar6 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                             (&pEVar7->super_BaseExpression);
          Value::operator=(&local_f0,&pBVar6->value);
          bVar1 = pBVar8->lower_inclusive;
          pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(&pBVar8->upper);
          pBVar6 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                             (&pEVar7->super_BaseExpression);
          Value::operator=(&local_b0,&pBVar6->value);
          type = bVar1 * '\x02' | COMPARE_GREATERTHAN;
          EVar2 = pBVar8->upper_inclusive * '\x02' + COMPARE_LESSTHAN;
          goto LAB_016ef127;
        }
      }
    }
LAB_016ef14f:
    (this->super_BoundIndex).super_Index._vptr_Index = (_func_int **)0x0;
  }
LAB_016ef17f:
  if (local_198.
      super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.
                    super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_178._0_8_ = &PTR__ComparisonExpressionMatcher_024715b8;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
             *)&local_158);
  local_178._0_8_ = &PTR__ExpressionMatcher_02471500;
  if ((tuple<duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>)local_178._24_8_ !=
      (_Head_base<0UL,_duckdb::TypeMatcher_*,_false>)0x0) {
    (*(*(_func_int ***)local_178._24_8_)[1])();
  }
  local_178._24_8_ =
       (_Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>)0x0;
  if ((ExpressionTypeMatcher *)local_178._16_8_ != (ExpressionTypeMatcher *)0x0) {
    (*(*(_func_int ***)local_178._16_8_)[1])();
  }
  Value::~Value(&local_70);
  Value::~Value(&local_b0);
  Value::~Value(&local_f0);
  return (unique_ptr<duckdb::IndexScanState,_std::default_delete<duckdb::IndexScanState>_>)
         (unique_ptr<duckdb::IndexScanState,_std::default_delete<duckdb::IndexScanState>_>)this;
}

Assistant:

unique_ptr<IndexScanState> ART::TryInitializeScan(const Expression &expr, const Expression &filter_expr) {
	Value low_value, high_value, equal_value;
	ExpressionType low_comparison_type = ExpressionType::INVALID, high_comparison_type = ExpressionType::INVALID;

	// Try to find a matching index for any of the filter expressions.
	ComparisonExpressionMatcher matcher;

	// Match on a comparison type.
	matcher.expr_type = make_uniq<ComparisonExpressionTypeMatcher>();

	// Match on a constant comparison with the indexed expression.
	matcher.matchers.push_back(make_uniq<ExpressionEqualityMatcher>(expr));
	matcher.matchers.push_back(make_uniq<ConstantExpressionMatcher>());
	matcher.policy = SetMatcher::Policy::UNORDERED;

	vector<reference<Expression>> bindings;
	auto filter_match =
	    matcher.Match(const_cast<Expression &>(filter_expr), bindings); // NOLINT: Match does not alter the expr.
	if (filter_match) {
		// This is a range or equality comparison with a constant value, so we can use the index.
		// 		bindings[0] = the expression
		// 		bindings[1] = the index expression
		// 		bindings[2] = the constant
		auto &comparison = bindings[0].get().Cast<BoundComparisonExpression>();
		auto constant_value = bindings[2].get().Cast<BoundConstantExpression>().value;
		auto comparison_type = comparison.GetExpressionType();

		if (comparison.left->GetExpressionType() == ExpressionType::VALUE_CONSTANT) {
			// The expression is on the right side, we flip the comparison expression.
			comparison_type = FlipComparisonExpression(comparison_type);
		}

		if (comparison_type == ExpressionType::COMPARE_EQUAL) {
			// An equality value overrides any other bounds.
			equal_value = constant_value;
		} else if (comparison_type == ExpressionType::COMPARE_GREATERTHANOREQUALTO ||
		           comparison_type == ExpressionType::COMPARE_GREATERTHAN) {
			// This is a lower bound.
			low_value = constant_value;
			low_comparison_type = comparison_type;
		} else {
			// This is an upper bound.
			high_value = constant_value;
			high_comparison_type = comparison_type;
		}

	} else if (filter_expr.GetExpressionType() == ExpressionType::COMPARE_BETWEEN) {
		auto &between = filter_expr.Cast<BoundBetweenExpression>();
		if (!between.input->Equals(expr)) {
			// The expression does not match the index expression.
			return nullptr;
		}

		if (between.lower->GetExpressionType() != ExpressionType::VALUE_CONSTANT ||
		    between.upper->GetExpressionType() != ExpressionType::VALUE_CONSTANT) {
			// Not a constant expression.
			return nullptr;
		}

		low_value = between.lower->Cast<BoundConstantExpression>().value;
		low_comparison_type = between.lower_inclusive ? ExpressionType::COMPARE_GREATERTHANOREQUALTO
		                                              : ExpressionType::COMPARE_GREATERTHAN;
		high_value = (between.upper->Cast<BoundConstantExpression>()).value;
		high_comparison_type =
		    between.upper_inclusive ? ExpressionType::COMPARE_LESSTHANOREQUALTO : ExpressionType::COMPARE_LESSTHAN;
	}

	// We cannot use an index scan.
	if (equal_value.IsNull() && low_value.IsNull() && high_value.IsNull()) {
		return nullptr;
	}

	// Initialize the index scan state and return it.
	if (!equal_value.IsNull()) {
		// Equality predicate.
		return InitializeScanSinglePredicate(equal_value, ExpressionType::COMPARE_EQUAL);
	}
	if (!low_value.IsNull() && !high_value.IsNull()) {
		// Two-sided predicate.
		return InitializeScanTwoPredicates(low_value, low_comparison_type, high_value, high_comparison_type);
	}
	if (!low_value.IsNull()) {
		// Less-than predicate.
		return InitializeScanSinglePredicate(low_value, low_comparison_type);
	}
	// Greater-than predicate.
	return InitializeScanSinglePredicate(high_value, high_comparison_type);
}